

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiTableFlags TableFixFlags(ImGuiTableFlags flags,ImGuiWindow *outer_window)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = flags & 0xe000;
  if (uVar2 == 0) {
    uVar2 = 0x2000;
    if ((((uint)flags >> 0x18 & 1) == 0) && (uVar2 = 0x2000, (outer_window->Flags & 0x40) == 0)) {
      uVar2 = 0x8000;
    }
    flags = flags | uVar2;
  }
  uVar3 = flags | 0x40000;
  if (uVar2 != 0x4000) {
    uVar3 = flags;
  }
  uVar2 = uVar3 & 0xfffcffff;
  if ((uVar3 & 0x3000000) == 0) {
    uVar2 = uVar3;
  }
  uVar1 = uVar2 & 0xfffff7ff;
  if ((uVar2 >> 0xc & 1) == 0) {
    uVar1 = uVar2;
  }
  uVar2 = (uVar3 & 1) << 9 | uVar1;
  uVar3 = uVar2 | 0x10;
  if ((uVar1 & 0xf) == 0) {
    uVar2 = uVar3;
  }
  if ((outer_window->RootWindow->Flags & 0x100) != 0) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

inline ImGuiTableFlags TableFixFlags(ImGuiTableFlags flags, ImGuiWindow* outer_window)
{
    // Adjust flags: set default sizing policy
    if ((flags & ImGuiTableFlags_SizingMask_) == 0)
        flags |= ((flags & ImGuiTableFlags_ScrollX) || (outer_window->Flags & ImGuiWindowFlags_AlwaysAutoResize)) ? ImGuiTableFlags_SizingFixedFit : ImGuiTableFlags_SizingStretchSame;

    // Adjust flags: enable NoKeepColumnsVisible when using ImGuiTableFlags_SizingFixedSame
    if ((flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedSame)
        flags |= ImGuiTableFlags_NoKeepColumnsVisible;

    // Adjust flags: enforce borders when resizable
    if (flags & ImGuiTableFlags_Resizable)
        flags |= ImGuiTableFlags_BordersInnerV;

    // Adjust flags: disable NoHostExtendX/NoHostExtendY if we have any scrolling going on
    if (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY))
        flags &= ~(ImGuiTableFlags_NoHostExtendX | ImGuiTableFlags_NoHostExtendY);

    // Adjust flags: NoBordersInBodyUntilResize takes priority over NoBordersInBody
    if (flags & ImGuiTableFlags_NoBordersInBodyUntilResize)
        flags &= ~ImGuiTableFlags_NoBordersInBody;

    // Adjust flags: disable saved settings if there's nothing to save
    if ((flags & (ImGuiTableFlags_Resizable | ImGuiTableFlags_Hideable | ImGuiTableFlags_Reorderable | ImGuiTableFlags_Sortable)) == 0)
        flags |= ImGuiTableFlags_NoSavedSettings;

    // Inherit _NoSavedSettings from top-level window (child windows always have _NoSavedSettings set)
#ifdef IMGUI_HAS_DOCK
    ImGuiWindow* window_for_settings = outer_window->RootWindowDockStop;
#else
    ImGuiWindow* window_for_settings = outer_window->RootWindow;
#endif
    if (window_for_settings->Flags & ImGuiWindowFlags_NoSavedSettings)
        flags |= ImGuiTableFlags_NoSavedSettings;

    return flags;
}